

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

void __thiscall prometheus::Histogram::Histogram(Histogram *this,BucketBoundaries *buckets)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  invalid_argument *this_00;
  double *pdVar4;
  double *pdVar5;
  allocator_type local_21;
  
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  ::std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::vector
            (&this->bucket_counts_,
             ((long)(this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,&local_21);
  (this->sum_).value_._M_i = 0.0;
  pdVar2 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = pdVar3;
  if (pdVar2 != pdVar3) {
    do {
      pdVar4 = pdVar2 + 1;
      pdVar5 = pdVar3;
      if (pdVar4 == pdVar3) break;
      dVar1 = *pdVar2;
      pdVar5 = pdVar2;
      pdVar2 = pdVar4;
    } while (dVar1 < *pdVar4);
  }
  if (pdVar5 != pdVar3) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(this_00,"Bucket Boundaries must be strictly sorted");
    __cxa_throw(this_00,&::std::invalid_argument::typeinfo,
                ::std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

Histogram::Histogram(BucketBoundaries&& buckets)
    : bucket_boundaries_{std::move(buckets)},
      bucket_counts_{bucket_boundaries_.size() + 1} {
  if (!is_strict_sorted(begin(bucket_boundaries_), end(bucket_boundaries_))) {
    throw std::invalid_argument("Bucket Boundaries must be strictly sorted");
  }
}